

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGeneratorObjectStrings::Feed
          (cmMakefileTargetGeneratorObjectStrings *this,string *obj)

{
  long lVar1;
  long lVar2;
  string local_38;
  string *local_18;
  string *obj_local;
  cmMakefileTargetGeneratorObjectStrings *this_local;
  
  local_18 = obj;
  obj_local = (string *)this;
  cmOutputConverter::Convert
            (&local_38,&(this->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter,obj,
             START_OUTPUT,RESPONSE);
  std::__cxx11::string::operator=((string *)&this->NextObject,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (this->LengthLimit != 0xffffffffffffffff) {
    lVar1 = std::__cxx11::string::length();
    lVar2 = std::__cxx11::string::length();
    if (this->LengthLimit < (ulong)(lVar1 + 1 + lVar2)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this->Strings,&this->CurrentString);
      std::__cxx11::string::operator=((string *)&this->CurrentString,"");
      this->Space = "";
    }
  }
  std::__cxx11::string::operator+=((string *)&this->CurrentString,this->Space);
  this->Space = " ";
  std::__cxx11::string::operator+=((string *)&this->CurrentString,(string *)&this->NextObject);
  return;
}

Assistant:

void Feed(std::string const& obj)
    {
    // Construct the name of the next object.
    this->NextObject =
      this->LocalGenerator->Convert(obj,
                                    cmLocalGenerator::START_OUTPUT,
                                    cmLocalGenerator::RESPONSE);

    // Roll over to next string if the limit will be exceeded.
    if(this->LengthLimit != std::string::npos &&
       (this->CurrentString.length() + 1 + this->NextObject.length()
        > this->LengthLimit))
      {
      this->Strings.push_back(this->CurrentString);
      this->CurrentString = "";
      this->Space = "";
      }

    // Separate from previous object.
    this->CurrentString += this->Space;
    this->Space = " ";

    // Append this object.
    this->CurrentString += this->NextObject;
    }